

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O1

option * __thiscall
CLOptions::DefineOptSingle
          (option *__return_storage_ptr__,CLOptions *this,string *name,int has_arg,int *flag,
          char val)

{
  int iVar1;
  pointer pcVar2;
  undefined3 in_register_00000089;
  
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 == 0) {
    pcVar2 = (pointer)0x0;
  }
  else {
    pcVar2 = (name->_M_dataplus)._M_p;
  }
  __return_storage_ptr__->name = pcVar2;
  __return_storage_ptr__->has_arg = has_arg;
  __return_storage_ptr__->flag = flag;
  __return_storage_ptr__->val = CONCAT31(in_register_00000089,val);
  return __return_storage_ptr__;
}

Assistant:

struct option CLOptions::DefineOptSingle(const std::string& name, int has_arg, int *flag, char val)
{
    struct option new_opt ;
    new_opt.name = (name != "") ? name.c_str() : 0 ;
    new_opt.has_arg = has_arg ;
    new_opt.flag = flag ;
    new_opt.val = val;
    
    return new_opt ;
}